

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_EX(void)

{
  bool bVar1;
  EBracketType EVar2;
  Z80Reg ZVar3;
  int iVar4;
  Z80Reg local_20;
  Z80Reg ZStack_1c;
  bool has_comma;
  Z80Reg reg2;
  Z80Reg reg1;
  int e [4];
  
  _reg2 = 0xffffffffffffffff;
  e[0] = -1;
  e[1] = -1;
  ZStack_1c = GetRegister(&::lp);
  local_20 = Z80_UNK;
  if (ZStack_1c == Z80_SP) {
    ZStack_1c = Z80_UNK;
  }
  else if ((((ZStack_1c == Z80_UNK) && (EVar2 = OpenBracket(&::lp), EVar2 != BT_NONE)) &&
           (ZVar3 = GetRegister(&::lp), ZVar3 == Z80_SP)) &&
          (iVar4 = CloseBracket(&::lp), iVar4 != 0)) {
    ZStack_1c = Z80_SP;
  }
  bVar1 = comma(&::lp);
  if (bVar1) {
    local_20 = GetRegister(&::lp);
    if ((local_20 == Z80_AF) && (*::lp == '\'')) {
      ::lp = ::lp + 1;
    }
    if (((local_20 == Z80_UNK) && (EVar2 = OpenBracket(&::lp), EVar2 != BT_NONE)) &&
       ((ZVar3 = GetRegister(&::lp), ZVar3 == Z80_SP && (iVar4 = CloseBracket(&::lp), iVar4 != 0))))
    {
      local_20 = ZStack_1c;
      ZStack_1c = Z80_SP;
    }
  }
  if ((ZStack_1c == Z80_DE) || (ZStack_1c == Z80_HL)) {
    if (bVar1) {
      if ((ZStack_1c ^ Z80_BC) == local_20) {
        _reg2 = CONCAT44(reg1,0xeb);
      }
    }
    else {
      Error("[EX] Comma expected",(char *)0x0,PASS3);
    }
  }
  else if (ZStack_1c == Z80_SP) {
    if (bVar1) {
      if (local_20 == Z80_HL) {
        _reg2 = CONCAT44(reg1,0xe3);
      }
      else if ((local_20 == Z80_IX) || (local_20 == Z80_IY)) {
        _reg2 = CONCAT44(0xe3,local_20);
      }
    }
    else {
      Error("[EX] Comma expected",(char *)0x0,PASS3);
    }
  }
  else if (((ZStack_1c == Z80_AF) && ((Options::IsI8080 & 1) == 0)) &&
          ((!bVar1 || (local_20 == Z80_AF)))) {
    _reg2 = CONCAT44(reg1,8);
  }
  EmitBytes(&reg2,true);
  return;
}

Assistant:

static void OpCode_EX() {
		int e[] { -1, -1, -1, -1 };
		// parse first and optional second register, swap them for "(sp)" to have sp always first
		Z80Reg reg1 = GetRegister(lp), reg2 = Z80_UNK;
		if (Z80_SP == reg1) {
			reg1 = Z80_UNK;		// naked SP should not work, must be in brackets
		} else if (Z80_UNK == reg1 && BT_NONE != OpenBracket(lp) && Z80_SP == GetRegister(lp) && CloseBracket(lp)) {
			reg1 = Z80_SP;						// using SP register constant for MEM_SP situation
		}
		bool has_comma = comma(lp);
		if (has_comma) {
			reg2 = GetRegister(lp);
			if (Z80_AF == reg2 && *lp == '\'') ++lp;
			if (Z80_UNK == reg2 && BT_NONE != OpenBracket(lp) && Z80_SP == GetRegister(lp) && CloseBracket(lp)) {
				// "(sp)" at right side, swap it with reg1 (official Zilog syntax)
				reg2 = reg1;
				reg1 = Z80_SP;					// using SP register constant for MEM_SP situation
			}
		}
		switch (reg1) {
		case Z80_AF:
			if (Options::IsI8080) break;
			if (has_comma && Z80_AF != reg2) break;
			e[0] = 0x08;
			break;
		case Z80_DE:
		case Z80_HL:
			if (!has_comma) {
				Error("[EX] Comma expected");
				break;
			}
			if (Z80Reg(reg1 ^ Z80_DE ^ Z80_HL) != reg2) break;	// check for the other one: DE <-> HL
			e[0] = 0xeb;
			break;
		case Z80_SP:
			if (!has_comma) {
				Error("[EX] Comma expected");
				break;
			}
			switch (reg2) {
			case Z80_HL:
				e[0] = 0xe3; break;
			case Z80_IX:
			case Z80_IY:
				e[0] = reg2; e[1] = 0xe3; break;
			default:
				break;
			}
			break;
		default:
			break;
		}
		EmitBytes(e, true);
	}